

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

void hookf(lua_State *L,lua_Debug *ar)

{
  TValue *pTVar1;
  int iVar2;
  lua_State *in_RSI;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  
  pTVar1 = in_RDI->top;
  in_RDI->top = pTVar1 + 1;
  pTVar1->n = -5.13828271674896e-322;
  lua_rawget(unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  iVar2 = lua_type(in_RDI,(int)((ulong)in_RSI >> 0x20));
  if (iVar2 == 6) {
    lua_pushstring((lua_State *)ar,(char *)unaff_retaddr);
    if ((int)(in_RSI->openupval).gcptr32 < 0) {
      lua_pushnil(in_RSI);
    }
    else {
      lua_pushinteger(in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    }
    lua_call(in_RSI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  }
  return;
}

Assistant:

static void hookf(lua_State *L, lua_Debug *ar)
{
  static const char *const hooknames[] =
    {"call", "return", "line", "count", "tail return"};
  (L->top++)->u64 = KEY_HOOK;
  lua_rawget(L, LUA_REGISTRYINDEX);
  if (lua_isfunction(L, -1)) {
    lua_pushstring(L, hooknames[(int)ar->event]);
    if (ar->currentline >= 0)
      lua_pushinteger(L, ar->currentline);
    else lua_pushnil(L);
    lua_call(L, 2, 0);
  }
}